

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaB_next(lua_State *L)

{
  TValue *key;
  double dVar1;
  StkId pTVar2;
  GCObject *t_00;
  int iVar3;
  int iVar4;
  Node *pNVar5;
  long lVar6;
  long lVar7;
  StkId pTVar8;
  Value *pVVar9;
  StkId pTVar10;
  byte bVar11;
  long lVar12;
  StkId t;
  int iVar13;
  
  luaL_checktype(L,1,5);
  pTVar8 = L->top;
  pTVar2 = L->base;
  pTVar10 = pTVar2 + 2;
  if (pTVar8 < pTVar10) {
    do {
      pTVar8->tt = 0;
      pTVar8 = pTVar8 + 1;
    } while (pTVar8 < pTVar10);
    L->top = pTVar8;
  }
  L->top = pTVar10;
  t_00 = (pTVar2->value).gc;
  iVar4 = pTVar2[1].tt;
  if (iVar4 == 0) {
    iVar3 = -1;
  }
  else {
    key = pTVar2 + 1;
    if (iVar4 == 3) {
      dVar1 = (key->value).n;
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1)))
      goto LAB_00109655;
      iVar3 = (int)dVar1;
    }
    else {
LAB_00109655:
      iVar3 = -1;
    }
    if ((iVar3 < 1) || ((t_00->h).sizearray < iVar3)) {
      pNVar5 = mainposition(&t_00->h,key);
      while( true ) {
        iVar3 = luaO_rawequalObj(&(pNVar5->i_key).tvk,key);
        if ((iVar3 != 0) ||
           (((3 < iVar4 && ((pNVar5->i_key).nk.tt == 0xb)) &&
            ((pNVar5->i_key).nk.value.gc == (key->value).gc)))) break;
        pNVar5 = (pNVar5->i_key).nk.next;
        if (pNVar5 == (Node *)0x0) {
          luaG_runerror(L,"invalid key to \'next\'");
        }
      }
      iVar3 = (int)((ulong)((long)pNVar5 - (long)(t_00->h).node) >> 3) * -0x33333333 +
              (t_00->h).sizearray;
    }
    else {
      iVar3 = iVar3 + -1;
    }
  }
  iVar4 = (t_00->h).sizearray;
  lVar6 = (long)iVar3 + 1;
  iVar13 = iVar4;
  if (iVar4 < lVar6) {
    iVar13 = (int)lVar6;
  }
  lVar7 = (long)iVar3 << 4;
  do {
    lVar12 = lVar7;
    if (iVar4 <= lVar6) {
      bVar11 = 1;
      if ((int)(1L << ((t_00->h).lsizenode & 0x3f)) <= iVar13 - iVar4) goto LAB_0010979f;
      pNVar5 = (t_00->h).node;
      lVar7 = (long)((int)lVar6 - iVar4);
      lVar6 = lVar7 * 0x28;
      goto LAB_00109767;
    }
    lVar6 = lVar6 + 1;
    lVar7 = lVar12 + 0x10;
  } while (*(int *)((long)&(t_00->h).array[1].tt + lVar12) == 0);
  pTVar2[1].value.n = (double)(int)lVar6;
  pTVar2[1].tt = 3;
  pVVar9 = (Value *)((long)&(t_00->h).array[1].value + lVar12);
LAB_00109790:
  pTVar2[2].value = *pVVar9;
  pTVar2[2].tt = pVVar9[1].b;
  bVar11 = 0;
LAB_0010979f:
  pTVar10 = L->top + (ulong)(bVar11 ^ 1) * 2;
  L->top = pTVar10 + -1;
  iVar4 = 2;
  if (bVar11 != 0) {
    pTVar10[-1].tt = 0;
    L->top = pTVar10;
    iVar4 = 1;
  }
  return iVar4;
  while( true ) {
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x28;
    if ((0x100000000 << ((t_00->h).lsizenode & 0x3f)) >> 0x20 <= lVar7) break;
LAB_00109767:
    if (*(int *)((long)&(pNVar5->i_val).tt + lVar6) != 0) {
      pTVar2[1].value = *(Value *)((long)&pNVar5->i_key + lVar6);
      pTVar2[1].tt = *(int *)((long)&pNVar5->i_key + lVar6 + 8);
      pVVar9 = (Value *)((long)&(((t_00->h).node)->i_val).value + lVar6);
      goto LAB_00109790;
    }
  }
  goto LAB_0010979f;
}

Assistant:

static int luaB_next(lua_State*L){
luaL_checktype(L,1,5);
lua_settop(L,2);
if(lua_next(L,1))
return 2;
else{
lua_pushnil(L);
return 1;
}
}